

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.h
# Opt level: O2

int32_t __thiscall icu_63::SimpleFormatter::getArgumentLimit(SimpleFormatter *this)

{
  short sVar1;
  uint uVar2;
  char16_t *pcVar3;
  int iVar4;
  
  pcVar3 = UnicodeString::getBuffer(&this->compiledPattern);
  sVar1 = (this->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (this->compiledPattern).fUnion.fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (iVar4 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)(ushort)*pcVar3;
  }
  return uVar2;
}

Assistant:

int32_t getArgumentLimit() const {
        return getArgumentLimit(compiledPattern.getBuffer(), compiledPattern.length());
    }